

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FBI.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::EBCellFlagFab>::FB_local_copy_cpu
          (FabArray<amrex::EBCellFlagFab> *this,FB *TheFB,int scomp,int ncomp)

{
  bool bVar1;
  int iVar2;
  type this_00;
  size_type sVar3;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  *this_01;
  const_reference this_02;
  IntVect *pIVar4;
  undefined4 in_ECX;
  byte *in_RSI;
  FabArrayBase *in_RDI;
  Dim3 offset;
  Array4<const_amrex::EBCellFlag> sfab_1;
  FabCopyTag<amrex::EBCellFlagFab> *tag_2;
  const_iterator __end0;
  const_iterator __begin0;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *__range4;
  Array4<amrex::EBCellFlag> dfab_1;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *tags;
  MFIter mfi;
  CopyComTag *tag_1;
  int i_1;
  LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  loc_copy_tags;
  EBCellFlagFab *dfab;
  EBCellFlagFab *sfab;
  CopyComTag *tag;
  int i;
  bool is_thread_safe;
  int N_locs;
  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_> *LocTags
  ;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  FabArray<amrex::EBCellFlagFab> *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  DistributionMapping *in_stack_fffffffffffffaf0;
  BoxArray *in_stack_fffffffffffffaf8;
  MFIter *in_stack_fffffffffffffb10;
  anon_class_152_4_dcf20601 *in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb34;
  Box *in_stack_fffffffffffffb38;
  undefined1 auStack_4a8 [64];
  undefined8 local_468;
  int local_460;
  undefined8 local_458;
  int local_450;
  undefined8 local_444;
  int local_43c;
  Array4<const_amrex::EBCellFlag> local_438;
  reference local_3f8;
  FabCopyTag<amrex::EBCellFlagFab> *local_3f0;
  __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
  local_3e8;
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *local_3e0;
  undefined1 local_3d8 [64];
  Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
  *local_398;
  int in_stack_fffffffffffffc74;
  FabArrayBase *in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc84;
  Box *in_stack_fffffffffffffc88;
  BaseFab<amrex::EBCellFlag> *in_stack_fffffffffffffc90;
  BaseFab<amrex::EBCellFlag> *in_stack_fffffffffffffc98;
  int local_2d4;
  int local_1a4;
  IntVect local_158;
  undefined4 local_14c;
  IntVect *local_148;
  undefined4 local_13c;
  IntVect *local_138;
  undefined4 local_12c;
  IntVect *local_128;
  EBCellFlagFab *local_120;
  undefined8 local_118;
  int local_110;
  IntVect *local_108;
  int local_fc;
  int iStack_f8;
  int local_f4;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 in_stack_ffffffffffffff50;
  
  this_00 = std::
            unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
            ::operator*((unique_ptr<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                         *)in_stack_fffffffffffffae0);
  sVar3 = std::
          vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
          ::size(this_00);
  iVar2 = (int)sVar3;
  if (iVar2 != 0) {
    if ((*in_RSI & 1) == 0) {
      this_01 = (LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                 *)FabArrayBase::boxArray(in_RDI);
      FabArrayBase::DistributionMap(in_RDI);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::LayoutData(this_01,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0);
      for (local_2d4 = 0; local_2d4 < iVar2; local_2d4 = local_2d4 + 1) {
        this_02 = std::
                  vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                  ::operator[](this_00,(long)local_2d4);
        LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
        ::operator[]((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                      *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
        fabPtr(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
        pIVar4 = Box::smallEnd(&this_02->sbox);
        local_148 = Box::smallEnd(&this_02->dbox);
        local_12c = 0;
        local_13c = 1;
        local_14c = 2;
        local_138 = local_148;
        local_128 = local_148;
        IntVect::IntVect(&local_158,pIVar4->vect[0] - local_148->vect[0],
                         pIVar4->vect[1] - local_148->vect[1],pIVar4->vect[2] - local_148->vect[2]);
        std::
        vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
        ::push_back((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                     *)in_stack_fffffffffffffae0,
                    (value_type *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      }
      MFIter::MFIter(in_stack_fffffffffffffb10,in_RDI,(uchar)((ulong)this_01 >> 0x38));
      while (bVar1 = MFIter::isValid((MFIter *)&stack0xfffffffffffffc70), bVar1) {
        local_398 = LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                    ::operator[]((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                  *)in_stack_fffffffffffffae0,
                                 (MFIter *)
                                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        array<amrex::EBCellFlagFab,_0>
                  ((FabArray<amrex::EBCellFlagFab> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
                   (MFIter *)in_stack_fffffffffffffae0);
        local_3e0 = local_398;
        local_3e8._M_current =
             (FabCopyTag<amrex::EBCellFlagFab> *)
             std::
             vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
             ::begin((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                      *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        local_3f0 = (FabCopyTag<amrex::EBCellFlagFab> *)
                    std::
                    vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                    ::end((vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>
                           *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                   *)in_stack_fffffffffffffae0,
                                  (__normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8)),
              bVar1) {
          local_3f8 = __gnu_cxx::
                      __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                      ::operator*(&local_3e8);
          local_120 = local_3f8->sfab;
          local_b4 = (local_120->super_BaseFab<amrex::EBCellFlag>).nvar;
          local_d0.x = (local_120->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
          local_d0.y = (local_120->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
          local_d0.z = (local_120->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
          local_f0.z = (local_120->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
          local_f0.y = (local_120->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
          local_f0.x = (local_120->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] + 1;
          local_e0._0_8_ = local_f0._0_8_;
          local_e0.z = local_f0.z;
          local_c0._0_8_ = local_d0._0_8_;
          local_c0.z = local_d0.z;
          Array4<const_amrex::EBCellFlag>::Array4
                    (&local_438,(local_120->super_BaseFab<amrex::EBCellFlag>).dptr,&local_c0,
                     &local_e0,local_b4);
          local_108 = &local_3f8->offset;
          local_fc = local_108->vect[0];
          iStack_f8 = (local_3f8->offset).vect[1];
          local_458 = *(undefined8 *)local_108->vect;
          local_450 = (local_3f8->offset).vect[2];
          in_stack_fffffffffffffae0 = (FabArray<amrex::EBCellFlagFab> *)&local_3f8->dbox;
          in_stack_fffffffffffffaec = in_ECX;
          local_444 = local_458;
          local_43c = local_450;
          local_118 = local_458;
          local_110 = local_450;
          local_f4 = local_450;
          memcpy(&stack0xfffffffffffffb10,local_3d8,0x3c);
          memcpy(auStack_4a8,&local_438,0x3c);
          local_468 = local_444;
          local_460 = local_43c;
          LoopConcurrentOnCpu<amrex::FabArray<amrex::EBCellFlagFab>::FB_local_copy_cpu(amrex::FabArrayBase::FB_const&,int,int)::_lambda(int,int,int,int)_1_>
                    (in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,in_stack_fffffffffffffb28);
          __gnu_cxx::
          __normal_iterator<const_amrex::FabCopyTag<amrex::EBCellFlagFab>_*,_std::vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
          ::operator++(&local_3e8);
        }
        MFIter::operator++((MFIter *)&stack0xfffffffffffffc70);
      }
      MFIter::~MFIter((MFIter *)in_stack_fffffffffffffae0);
      LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
      ::~LayoutData((LayoutData<amrex::Vector<amrex::FabCopyTag<amrex::EBCellFlagFab>,_std::allocator<amrex::FabCopyTag<amrex::EBCellFlagFab>_>_>_>
                     *)in_stack_fffffffffffffae0);
    }
    else {
      for (local_1a4 = 0; local_1a4 < iVar2; local_1a4 = local_1a4 + 1) {
        std::
        vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>::
        operator[](this_00,(long)local_1a4);
        get(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
        get(in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
        BaseFab<amrex::EBCellFlag>::copy<(amrex::RunOn)1>
                  (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
                   in_stack_fffffffffffffc84,(Box *)in_stack_fffffffffffffc78,
                   in_stack_fffffffffffffc74,(int)in_stack_ffffffffffffff50);
      }
    }
  }
  return;
}

Assistant:

void
FabArray<FAB>::FB_local_copy_cpu (const FB& TheFB, int scomp, int ncomp)
{
    auto const& LocTags = *(TheFB.m_LocTags);
    int N_locs = LocTags.size();
    if (N_locs == 0) return;
    bool is_thread_safe = TheFB.m_threadsafe_loc;
    if (is_thread_safe)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = LocTags[i];

            BL_ASSERT(distributionMap[tag.dstIndex] == ParallelDescriptor::MyProc());
            BL_ASSERT(distributionMap[tag.srcIndex] == ParallelDescriptor::MyProc());

            const FAB* sfab = &(get(tag.srcIndex));
                  FAB* dfab = &(get(tag.dstIndex));
            dfab->template copy<RunOn::Host>(*sfab, tag.sbox, scomp, tag.dbox, scomp, ncomp);
        }
    }
    else
    {
        LayoutData<Vector<FabCopyTag<FAB> > > loc_copy_tags(boxArray(),DistributionMap());
        for (int i = 0; i < N_locs; ++i)
        {
            const CopyComTag& tag = LocTags[i];

            BL_ASSERT(distributionMap[tag.dstIndex] == ParallelDescriptor::MyProc());
            BL_ASSERT(distributionMap[tag.srcIndex] == ParallelDescriptor::MyProc());

            loc_copy_tags[tag.dstIndex].push_back
                ({this->fabPtr(tag.srcIndex), tag.dbox, tag.sbox.smallEnd()-tag.dbox.smallEnd()});
        }
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*this); mfi.isValid(); ++mfi)
        {
            const auto& tags = loc_copy_tags[mfi];
            auto dfab = this->array(mfi);
            for (auto const & tag : tags)
            {
                auto const sfab = tag.sfab->array();
                const auto offset = tag.offset.dim3();
                amrex::LoopConcurrentOnCpu(tag.dbox, ncomp,
                [=] (int i, int j, int k, int n) noexcept
                {
                    dfab(i,j,k,n+scomp) = sfab(i+offset.x,j+offset.y,k+offset.z,n+scomp);
                });
            }
        }
    }
}